

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<ParamsStream<AutoFile&,TransactionSerParams>,std::vector<CTxOut,std::allocator<CTxOut>>>
          (VectorFormatter<DefaultFormatter> *this,ParamsStream<AutoFile_&,_TransactionSerParams> *s
          ,vector<CTxOut,_std::allocator<CTxOut>_> *v)

{
  pointer pCVar1;
  size_t in_RCX;
  value_type *elem;
  pointer pCVar2;
  long in_FS_OFFSET;
  CAmount local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<ParamsStream<AutoFile&,TransactionSerParams>>
            (s,((long)(v->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(v->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  pCVar2 = (v->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pCVar1 = (v->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pCVar2 != pCVar1) {
    do {
      local_30 = pCVar2->nValue;
      AutoFile::write(s->m_substream,(int)&local_30,&DAT_00000008,in_RCX);
      SerializeMany<ParamsStream<AutoFile&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
                (s,&(pCVar2->scriptPubKey).super_CScriptBase);
      pCVar2 = pCVar2 + 1;
    } while (pCVar2 != pCVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }